

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

Var Js::JavascriptFunction::CallSpreadFunction
              (RecyclableObject *function,Arguments *args,AuxArray<unsigned_int> *spreadIndices)

{
  long lVar1;
  Arguments *pAVar2;
  JavascriptMethod entryPoint;
  ScriptContext *scriptContext_00;
  ScriptContext *spreadIndices_00;
  ThreadContext *this;
  size_t __n;
  Var pvVar3;
  Type __s;
  undefined8 uStack_f0;
  Arguments *local_e8;
  JavascriptMethod local_e0;
  Arguments *local_d8;
  Arguments local_d0;
  Arguments local_c0;
  size_t local_b0;
  size_t outArgsSize;
  Var stackArgs [8];
  CallInfo local_60;
  undefined1 local_58 [8];
  Arguments outArgs;
  undefined1 local_40 [4];
  uint32 actualLength;
  uint local_2c;
  ScriptContext *pSStack_28;
  uint spreadSize;
  ScriptContext *scriptContext;
  AuxArray<unsigned_int> *spreadIndices_local;
  Arguments *args_local;
  RecyclableObject *function_local;
  
  __s = (Type)&local_e8;
  uStack_f0 = 0x1145d47;
  local_d8 = args;
  scriptContext = (ScriptContext *)spreadIndices;
  spreadIndices_local = (AuxArray<unsigned_int> *)args;
  args_local = (Arguments *)function;
  pSStack_28 = RecyclableObject::GetScriptContext(function);
  uStack_f0 = 0x1145d5b;
  Arguments::Arguments((Arguments *)local_40,local_d8);
  uStack_f0 = 0x1145d6c;
  local_2c = GetSpreadSize((Arguments *)local_40,(AuxArray<unsigned_int> *)scriptContext,pSStack_28)
  ;
  uStack_f0 = 0x1145d8d;
  outArgs.Values._4_4_ =
       CallInfo::GetLargeArgCountWithExtraArgs
                 (SUB84(local_d8->Info,3) &
                  (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed|
                   CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),local_2c);
  uStack_f0 = 0x1145db2;
  CallInfo::CallInfo(&local_60,
                     SUB84(local_d8->Info,3) &
                     (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                      CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                     CallFlags_New),local_2c);
  uStack_f0 = 0x1145dc3;
  Arguments::Arguments((Arguments *)local_58,local_60,(Var *)0x0);
  local_b0 = 0;
  if (outArgs.Values._4_4_ < 9) {
    outArgs.Info = (Type)&outArgsSize;
    local_b0 = 0x40;
    uStack_f0 = 0x1145e5e;
    memset((void *)outArgs.Info,0,0x40);
  }
  else {
    uStack_f0 = 0x1145ddd;
    this = ScriptContext::GetThreadContext(pSStack_28);
    uStack_f0 = 0x1145df8;
    ThreadContext::ProbeStack(this,(ulong)outArgs.Values._4_4_ * 8 + 0xc00,pSStack_28,(PVOID)0x0);
    __n = (ulong)outArgs.Values._4_4_ * 8;
    lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
    __s = (Type)((long)&local_e8 + lVar1);
    local_b0 = __n;
    outArgs.Info = __s;
    *(undefined8 *)((long)&uStack_f0 + lVar1) = 0x1145e34;
    memset((void *)__s,0,__n);
  }
  pAVar2 = local_d8;
  *(undefined8 *)((long)__s + -8) = 0x1145e71;
  Arguments::Arguments(&local_c0,pAVar2);
  spreadIndices_00 = scriptContext;
  scriptContext_00 = pSStack_28;
  *(undefined8 *)((long)__s + -8) = 0x1145e89;
  SpreadArgs(&local_c0,(Arguments *)local_58,(AuxArray<unsigned_int> *)spreadIndices_00,
             scriptContext_00);
  pAVar2 = args_local;
  local_e8 = args_local;
  *(undefined8 *)((long)__s + -8) = 0x1145e9d;
  local_e0 = RecyclableObject::GetEntryPoint((RecyclableObject *)pAVar2);
  *(undefined8 *)((long)__s + -8) = 0x1145eb4;
  Arguments::Arguments(&local_d0,(Arguments *)local_58);
  entryPoint = local_e0;
  pAVar2 = local_e8;
  *(undefined8 *)((long)__s + -8) = 0x1145ed3;
  pvVar3 = CallFunction<true>((RecyclableObject *)pAVar2,entryPoint,&local_d0,true);
  return pvVar3;
}

Assistant:

Var JavascriptFunction::CallSpreadFunction(RecyclableObject* function, Arguments args, const Js::AuxArray<uint32> *spreadIndices)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        // Work out the expanded number of arguments.
        uint spreadSize = GetSpreadSize(args, spreadIndices, scriptContext);
        uint32 actualLength = CallInfo::GetLargeArgCountWithExtraArgs(args.Info.Flags, spreadSize);

        // Allocate (if needed) space for the expanded arguments.
        Arguments outArgs(CallInfo(args.Info.Flags, spreadSize), nullptr);
        Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
        size_t outArgsSize = 0;
        if (actualLength > STACK_ARGS_ALLOCA_THRESHOLD)
        {
            PROBE_STACK(scriptContext, actualLength * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
            outArgsSize = actualLength * sizeof(Var);
            outArgs.Values = (Var*)_alloca(outArgsSize);
            ZeroMemory(outArgs.Values, outArgsSize);
        }
        else
        {
            outArgs.Values = stackArgs;
            outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
            ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
        }

        SpreadArgs(args, outArgs, spreadIndices, scriptContext);

        // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the large argcount logic in this case.
        return JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), outArgs, true);
    }